

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

MatchInfoCollection * __thiscall
icu_63::TimeZoneNamesImpl::find
          (TimeZoneNamesImpl *this,UnicodeString *text,int32_t start,uint32_t types,
          UErrorCode *status)

{
  MatchInfoCollection *pMVar1;
  ZNameSearchHandler handler;
  ZNameSearchHandler local_48;
  
  local_48.super_TextTrieMapSearchResultHandler._vptr_TextTrieMapSearchResultHandler =
       (_func_int **)&PTR_handleMatch_003e3d68;
  local_48.fMaxMatchLen = 0;
  local_48.fResults = (MatchInfoCollection *)0x0;
  local_48.fTypes = types;
  umtx_lock_63((UMutex *)gDataMutex);
  pMVar1 = doFind(this,&local_48,text,start,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (pMVar1 != (MatchInfoCollection *)0x0) goto LAB_0020f6d2;
    addAllNamesIntoTrie(this,status);
    pMVar1 = doFind(this,&local_48,text,start,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (pMVar1 != (MatchInfoCollection *)0x0) goto LAB_0020f6d2;
      internalLoadAllDisplayNames(this,status);
      addAllNamesIntoTrie(this,status);
      this->fNamesTrieFullyLoaded = '\x01';
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pMVar1 = doFind(this,&local_48,text,start,status);
        goto LAB_0020f6d2;
      }
    }
  }
  pMVar1 = (MatchInfoCollection *)0x0;
LAB_0020f6d2:
  umtx_unlock_63((UMutex *)gDataMutex);
  local_48.super_TextTrieMapSearchResultHandler._vptr_TextTrieMapSearchResultHandler =
       (_func_int **)&PTR_handleMatch_003e3d68;
  if (local_48.fResults != (MatchInfoCollection *)0x0) {
    (*(local_48.fResults)->_vptr_MatchInfoCollection[1])();
  }
  return pMVar1;
}

Assistant:

TimeZoneNames::MatchInfoCollection*
TimeZoneNamesImpl::find(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    ZNameSearchHandler handler(types);
    TimeZoneNames::MatchInfoCollection* matches;
    TimeZoneNamesImpl* nonConstThis = const_cast<TimeZoneNamesImpl*>(this);

    // Synchronize so that data is not loaded multiple times.
    // TODO: Consider more fine-grained synchronization.
    {
        Mutex lock(&gDataMutex);

        // First try of lookup.
        matches = doFind(handler, text, start, status);
        if (U_FAILURE(status)) { return NULL; }
        if (matches != NULL) {
            return matches;
        }

        // All names are not yet loaded into the trie.
        // We may have loaded names for formatting several time zones,
        // and might be parsing one of those.
        // Populate the parsing trie from all of the already-loaded names.
        nonConstThis->addAllNamesIntoTrie(status);

        // Second try of lookup.
        matches = doFind(handler, text, start, status);
        if (U_FAILURE(status)) { return NULL; }
        if (matches != NULL) {
            return matches;
        }

        // There are still some names we haven't loaded into the trie yet.
        // Load everything now.
        nonConstThis->internalLoadAllDisplayNames(status);
        nonConstThis->addAllNamesIntoTrie(status);
        nonConstThis->fNamesTrieFullyLoaded = TRUE;
        if (U_FAILURE(status)) { return NULL; }

        // Third try: we must return this one.
        return doFind(handler, text, start, status);
    }
}